

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportconsole.cpp
# Opt level: O2

void __thiscall
trun::ResultsReportConsole::PrintFailures
          (ResultsReportConsole *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  AssertErrorItem *pAVar2;
  FILE *__stream;
  bool bVar3;
  uint uVar4;
  string *psVar5;
  kTestResult kVar6;
  const_iterator __begin4;
  AssertErrorItem *pAVar7;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  shared_ptr<trun::TestResult> r;
  AssertErrorItem aerr;
  
  p_Var1 = &((results->
             super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
             )._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>;
  bVar3 = false;
  for (p_Var8 = &((results->
                  super__Vector_base<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>; p_Var8 != p_Var1;
      p_Var8 = p_Var8 + 1) {
    std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>,p_Var8);
    kVar6 = (r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->testResult;
    if (kVar6 != kTestResult_Pass) {
      if (!bVar3) {
        fwrite("Failed:\n",8,1,(FILE *)(this->super_ResultsReportPinterBase).fout);
        kVar6 = (r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                testResult;
      }
      uVar4 = snprintf(PrintFailures::lineHeader,0x40,"  [%c%c%c]: %s",
                       (ulong)((uint)(kVar6 != kTestResult_TestFail) << 5 | 0x54),
                       (ulong)((uint)(kVar6 != kTestResult_ModuleFail) << 5 | 0x4d),
                       (ulong)((uint)(kVar6 != kTestResult_AllFail) << 5 | 0x41),
                       ((r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                       ->symbolName)._M_dataplus._M_p);
      bVar3 = true;
      if (-1 < (int)uVar4) {
        if ((uVar4 < 0x40) &&
           ((r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->failState
            != Main)) {
          psVar5 = TestResult::FailStateName_abi_cxx11_
                             (r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
          snprintf(PrintFailures::lineHeader + uVar4,0x40 - (ulong)uVar4," (%s)",
                   (psVar5->_M_dataplus)._M_p);
        }
        pAVar7 = ((r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 assertError).assertErrors.
                 super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar2 = ((r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 assertError).assertErrors.
                 super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pAVar2 == pAVar7) {
          __stream = (FILE *)(this->super_ResultsReportPinterBase).fout;
          std::__cxx11::string::string
                    ((string *)&aerr,
                     &(r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      errorString);
          fprintf(__stream,"%s, %s\n",PrintFailures::lineHeader,CONCAT44(aerr.line,aerr._0_4_));
          std::__cxx11::string::~string((string *)&aerr);
        }
        else {
          for (; pAVar7 != pAVar2; pAVar7 = pAVar7 + 1) {
            AssertError::AssertErrorItem::AssertErrorItem(&aerr,pAVar7);
            fprintf((FILE *)(this->super_ResultsReportPinterBase).fout,"%s, %s:%d, %s\n",
                    PrintFailures::lineHeader,aerr.file._M_dataplus._M_p,(ulong)(uint)aerr.line,
                    aerr.message._M_dataplus._M_p);
            AssertError::AssertErrorItem::~AssertErrorItem(&aerr);
          }
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void ResultsReportConsole::PrintFailures(const std::vector<TestResult::Ref> &results) {
    bool haveHeader = false;
    static char lineHeader[64];
    for(auto r : results) {
        if (r->Result() != kTestResult_Pass) {
            // Only print this the first time if we have any...
            if (!haveHeader) {
                fprintf(fout, "Failed:\n");
                haveHeader = true;
            }
            auto nChars = snprintf(lineHeader, sizeof(lineHeader),"  [%c%c%c]: %s",
                     r->Result() == kTestResult_TestFail?'T':'t',
                     r->Result() == kTestResult_ModuleFail?'M':'m',
                     r->Result() == kTestResult_AllFail?'A':'a',
                     r->SymbolName().c_str());

            if (nChars < 0) {
                continue;
            }
            // Append if there is room left...
            if ((nChars < sizeof(lineHeader)) && (r->FailState() != TestResult::kFailState::Main)) {
                //fprintf(fout, " (%s)", r->FailStateName().c_str());
                snprintf(&lineHeader[nChars], sizeof(lineHeader) - nChars, " (%s)", r->FailStateName().c_str());
            }

            if (r->AssertError().NumErrors() > 0) {
                for(auto aerr : r->AssertError().Errors()) {
                    fprintf(fout, "%s, %s:%d, %s\n", lineHeader,
                            aerr.file.c_str(),
                            aerr.line,
                            aerr.message.c_str());
                }
            } else {
                fprintf(fout, "%s, %s\n", lineHeader, r->ErrorString().c_str());
            }
        }
    }
}